

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O2

int RDL_cmp_cycles(void *vc1,void *vc2)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar3 = 0;
  uVar6 = 0;
  uVar7 = 0;
  iVar2 = 0;
  do {
    uVar8 = (ulong)uVar7;
    cVar1 = *(char *)(*vc1 + uVar8);
    if (cVar1 == '\0') {
      cVar4 = *(char *)(*vc2 + uVar8);
    }
    else {
      if (cVar1 == '\x02') {
        if (uVar3 < uVar6) {
          uVar3 = 0xffffffff;
        }
        else if (uVar3 == uVar6) {
          uVar3 = 0xffffffff;
          if (iVar2 != 1) {
            uVar3 = (uint)(iVar2 != 0);
          }
        }
        else {
          uVar3 = 1;
        }
        return uVar3;
      }
      iVar5 = iVar2;
      if (iVar2 == 0) {
        iVar5 = 1;
      }
      uVar3 = uVar3 + 1;
      cVar4 = *(char *)(*vc2 + uVar8);
      if (cVar4 == '\0') {
        iVar2 = iVar5;
      }
    }
    if (cVar4 != '\0') {
      iVar5 = iVar2;
      if (iVar2 == 0) {
        iVar5 = 2;
      }
      uVar6 = uVar6 + 1;
      if (cVar1 == '\0') {
        iVar2 = iVar5;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int RDL_cmp_cycles(const void* vc1, const void* vc2)
{
  unsigned first_difference = 0;
  unsigned len1 = 0;
  unsigned len2 = 0;
  unsigned i = 0;

  const char* c1 = *((const char**) vc1);
  const char* c2 = *((const char**) vc2);

  while (c1[i] != 2) {
    if (c1[i]) {
      ++len1;
      if (!c2[i] && !first_difference) {
        first_difference = 1;
      }
    }
    if (c2[i]) {
      ++len2;
      if (!c1[i] && !first_difference) {
        first_difference = 2;
      }
    }
    ++i;
  }

  if (len1 < len2) {
    return -1;
  }
  else if (len1 == len2) {
    if (first_difference == 1) {
      return -1;
    }
    else if (first_difference == 0) {
      return 0;
    }
  }

  return 1;
}